

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O2

void __thiscall Dialog::on_key_down(Dialog *this,ALLEGRO_KEYBOARD_EVENT *event)

{
  if (event->display == this->display) {
    if (event->keycode == 0x3b) {
      this->quit_requested = true;
    }
    if (this->key_widget != (Widget *)0x0) {
      (*this->key_widget->_vptr_Widget[0xd])();
      return;
    }
  }
  return;
}

Assistant:

void Dialog::on_key_down(const ALLEGRO_KEYBOARD_EVENT & event)
{
   if (event.display != this->display) {
      return;
   }

   // XXX think of something better when we need it
   if (event.keycode == ALLEGRO_KEY_ESCAPE) {
      this->request_quit();
   }

   if (this->key_widget) {
      this->key_widget->on_key_down(event);
   }
}